

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O0

type_conflict6 __thiscall
jsoncons::basic_staj_event<char>::get_<long,std::allocator<char>>
          (void *param_1,size_t param_2,long *param_3)

{
  bool bVar1;
  to_integer_errc tVar2;
  type tVar3;
  type result;
  long val;
  undefined8 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  char *local_38;
  to_integer_errc local_30;
  ulong local_28;
  ulong local_8;
  
  switch(*param_1) {
  case 1:
    tVar3 = detail::to_integer<long,char>((char *)param_1,param_2,param_3);
    local_38 = tVar3.ptr;
    tVar2 = tVar3.ec;
    local_30 = tVar2;
    bVar1 = detail::to_integer_result::operator_cast_to_bool((to_integer_result *)&local_38);
    if (bVar1) {
      local_8 = local_28;
    }
    else {
      std::error_code::operator=
                ((error_code *)CONCAT71(in_stack_ffffffffffffffc1,tVar2),tVar3.ptr._4_4_);
      local_8 = 0;
    }
    break;
  default:
    std::error_code::operator=
              ((error_code *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),
               (conv_errc)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    local_8 = 0;
    break;
  case 4:
    local_8 = (ulong)(int)(uint)((*(byte *)((long)param_1 + 0x10) & 1) != 0);
    break;
  case 5:
    local_8 = *(ulong *)((long)param_1 + 0x10);
    break;
  case 6:
    local_8 = *(ulong *)((long)param_1 + 0x10);
    break;
  case 8:
    local_8 = (ulong)*(ushort *)((long)param_1 + 0x10);
    break;
  case 9:
    local_8 = (ulong)*(double *)((long)param_1 + 0x10);
  }
  return local_8;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<IntegerType>::value, IntegerType>::type
    get_(Allocator, std::error_code& ec) const
    {
        switch (event_type_)
        {
            case staj_event_type::string_value:
            {
                IntegerType val;
                auto result = jsoncons::detail::to_integer(value_.string_data_, length_, val);
                if (!result)
                {
                    ec = conv_errc::not_integer;
                    return IntegerType();
                }
                return val;
            }
            case staj_event_type::half_value:
                return static_cast<IntegerType>(value_.half_value_);
            case staj_event_type::double_value:
                return static_cast<IntegerType>(value_.double_value_);
            case staj_event_type::int64_value:
                return static_cast<IntegerType>(value_.int64_value_);
            case staj_event_type::uint64_value:
                return static_cast<IntegerType>(value_.uint64_value_);
            case staj_event_type::bool_value:
                return static_cast<IntegerType>(value_.bool_value_ ? 1 : 0);
            default:
                ec = conv_errc::not_integer;
                return IntegerType();
        }
    }